

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model_flattening.cpp
# Opt level: O0

void __thiscall
ModelFlattening_resolveFlattenMissingModel_Test::ModelFlattening_resolveFlattenMissingModel_Test
          (ModelFlattening_resolveFlattenMissingModel_Test *this)

{
  ModelFlattening_resolveFlattenMissingModel_Test *this_local;
  
  testing::Test::Test(&this->super_Test);
  *(undefined ***)this = &PTR__ModelFlattening_resolveFlattenMissingModel_Test_001a3a08;
  return;
}

Assistant:

TEST(ModelFlattening, resolveFlattenMissingModel)
{
    const std::string expectedError = "Component 'left' requires a model imported from 'diamond_point.cellml' which is not available in the importer.";
    auto parser = libcellml::Parser::create();
    auto originalModel = parser->parseModel(fileContents("importer/diamond.cellml"));
    auto importer = libcellml::Importer::create();

    // Resolve imports.
    importer->resolveImports(originalModel, resourcePath("importer/"));
    EXPECT_EQ(size_t(0), importer->issueCount());

    // Corrupt the importer library by removing a model that's required.
    importer->replaceModel(nullptr, importer->key(1));

    // Attempt to flatten the model.
    auto flatModel = importer->flattenModel(originalModel);
    EXPECT_EQ(size_t(1), importer->issueCount());
    EXPECT_EQ(expectedError, importer->issue(0)->description());
}